

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O0

void server::rename_cmd(int cid,char **args,int argc)

{
  bool bVar1;
  int iVar2;
  clientinfo *pcVar3;
  uchar *vals;
  ENetPacket *packet;
  char *pcVar4;
  char local_198 [8];
  string oldname;
  packetbuf v;
  undefined1 local_58 [8];
  vector<unsigned_char> buf;
  char newname [16];
  clientinfo *ci;
  char *name;
  int cn;
  int argc_local;
  char **args_local;
  int cid_local;
  
  bVar1 = QServ::getlastSA(&qs);
  if (bVar1) {
    iVar2 = atoi(args[1]);
    pcVar4 = args[2];
    pcVar3 = QServ::getClient(&qs,iVar2);
    if ((((pcVar3 != (clientinfo *)0x0) && (pcVar4 != (char *)0x0)) && (*pcVar4 != '\x01')) &&
       ((-1 < iVar2 && (iVar2 < 0x80)))) {
      filtertext<16ul>((char (*) [16])&buf.alen,pcVar4,false,true);
      putuint(&pcVar3->messages,0x68);
      sendstring((char *)&buf.alen,&pcVar3->messages);
      vector<unsigned_char>::vector((vector<unsigned_char> *)local_58);
      putuint((vector<unsigned_char> *)local_58,0x68);
      sendstring((char *)&buf.alen,(vector<unsigned_char> *)local_58);
      packetbuf::packetbuf((packetbuf *)(oldname + 0x100),5000,1);
      putuint((packetbuf *)(oldname + 0x100),0x58);
      putint((packetbuf *)(oldname + 0x100),pcVar3->clientnum);
      iVar2 = vector<unsigned_char>::length((vector<unsigned_char> *)local_58);
      putint((packetbuf *)(oldname + 0x100),iVar2);
      vals = vector<unsigned_char>::getbuf((vector<unsigned_char> *)local_58);
      iVar2 = vector<unsigned_char>::length((vector<unsigned_char> *)local_58);
      packetbuf::put((packetbuf *)(oldname + 0x100),vals,iVar2);
      iVar2 = pcVar3->clientnum;
      packet = packetbuf::finalize((packetbuf *)(oldname + 0x100));
      sendpacket(iVar2,1,packet,-1);
      copystring(local_198,pcVar3->name,0x104);
      copystring(pcVar3->name,(char *)&buf.alen,0x104);
      packetbuf::~packetbuf((packetbuf *)(oldname + 0x100));
      vector<unsigned_char>::~vector((vector<unsigned_char> *)local_58);
    }
  }
  else {
    iVar2 = QServ::getSender(&qs);
    pcVar4 = QServ::getCommandDesc(&qs,cid);
    sendf(iVar2,1,"ris",0x23,pcVar4);
  }
  return;
}

Assistant:

QSERV_CALLBACK rename_cmd(p) {
        if(CMD_SA) {
            int cn = atoi(args[1]);
            char *name = args[2];
            clientinfo *ci = qs.getClient(cn);
            if(!ci || name == NULL || name[0] == 1 || cn < 0 || cn >= 128) return;
            char newname[MAXNAMELEN + 1];
            newname[MAXNAMELEN] = 0;
            filtertext(newname, name, false, MAXNAMELEN);
            putuint(ci->messages, N_SWITCHNAME);
            sendstring(newname, ci->messages);
            vector<uchar> buf;
            putuint(buf, N_SWITCHNAME);
            sendstring(newname, buf);
            packetbuf v(MAXTRANS, ENET_PACKET_FLAG_RELIABLE);
            putuint(v, N_CLIENT);
            putint(v, ci->clientnum);
            putint(v, buf.length());
            v.put(buf.getbuf(), buf.length());
            sendpacket(ci->clientnum, 1, v.finalize(), -1);
            string oldname;
            copystring(oldname, ci->name);
            copystring(ci->name, newname);
        }
        else sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
    }